

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.cpp
# Opt level: O1

bool __thiscall Image2D::WritePixel2File(Image2D *this,Vec3 **colors)

{
  ofstream *this_00;
  float fVar1;
  float fVar2;
  FileType FVar3;
  Vec3 *pVVar4;
  bool bVar5;
  uchar *data;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long local_58;
  
  if (this->m_type == PPM) {
    bVar5 = OpenFile(this);
    if (bVar5) {
      this_00 = &this->m_ofstream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"P3\n",3);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->m_width);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_height);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"255\n",4);
      local_58 = (long)this->m_height;
      if (0 < local_58) {
        do {
          lVar7 = local_58 + -1;
          if (0 < this->m_width) {
            lVar8 = 0;
            do {
              pVVar4 = colors[lVar8];
              fVar1 = pVVar4[lVar7].e[1];
              fVar2 = pVVar4[lVar7].e[2];
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)this_00,(int)(pVVar4[lVar7].e[0] * 255.99));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)(fVar1 * 255.99));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)(fVar2 * 255.99));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              lVar8 = lVar8 + 1;
            } while (lVar8 < this->m_width);
          }
          bVar5 = 1 < local_58;
          local_58 = lVar7;
        } while (bVar5);
      }
      std::ofstream::close();
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  else {
    data = FramebufferToArray(this,colors);
    FVar3 = this->m_type;
    bVar5 = true;
    if (FVar3 == TGA) {
      stbi_write_tga((this->m_name)._M_dataplus._M_p,this->m_width,this->m_height,this->m_components
                     ,data);
    }
    else if (FVar3 == BMP) {
      stbi_write_bmp((this->m_name)._M_dataplus._M_p,this->m_width,this->m_height,this->m_components
                     ,data);
    }
    else if (FVar3 == PNG) {
      stbi_write_png((this->m_name)._M_dataplus._M_p,this->m_width,this->m_height,this->m_components
                     ,data,this->m_components * this->m_width);
    }
  }
  return bVar5;
}

Assistant:

bool
Image2D::WritePixel2File(Vec3 **colors)
{
	if (m_type == FileType::PPM) {
		if (!OpenFile()) {
			return false;
		}

		m_ofstream << "P3\n";
		m_ofstream << m_width << " " << m_height << "\n";
		m_ofstream << "255\n";

		for (int j = m_height - 1; j >= 0; --j) {
			for (int i = 0; i < m_width; ++i) {

				Vec3 color = colors[i][j];
				int r = int(255.99 * color[0]);
				int g = int(255.99 * color[1]);
				int b = int(255.99 * color[2]);

				m_ofstream << r << " " << g << " " << b << "\n";
			}
		}
		CloseFile();
	} 
	else {
		unsigned char *output_image = FramebufferToArray(colors);
		if (m_type == FileType::PNG) {
			stbi_write_png(m_name.c_str(), m_width, m_height, m_components, output_image, m_width * m_components);
		}
		else if (m_type == FileType::BMP) {
			stbi_write_bmp(m_name.c_str(), m_width, m_height, m_components, output_image);
		}
		else if (m_type == FileType::TGA) {
			stbi_write_tga(m_name.c_str(), m_width, m_height, m_components, output_image);
		}
		else if (m_type == FileType::HDR) {
			//tbi_write_hdr(m_name.c_str(), m_width, m_height, 3, output_image);
		}
	}

	return true;
}